

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

bool __thiscall HighsLpRelaxation::LpRow::isIntegral(LpRow *this,HighsMipSolver *mipsolver)

{
  long lVar1;
  
  if (this->origin == kModel) {
    lVar1 = 0x6490;
  }
  else {
    if (this->origin != kCutPool) {
      return false;
    }
    lVar1 = 0x1b8;
  }
  return *(char *)(*(long *)((long)&((mipsolver->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                    _M_head_impl)->mipsolver + lVar1) + (long)this->index) != '\0';
}

Assistant:

bool HighsLpRelaxation::LpRow::isIntegral(
    const HighsMipSolver& mipsolver) const {
  switch (origin) {
    case kCutPool:
      return mipsolver.mipdata_->cutpool.cutIsIntegral(index);
    case kModel:
      return (mipsolver.mipdata_->rowintegral[index] != 0);
  };

  assert(false);
  return false;
}